

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

void basist::bc1_find_sels_2
               (color32 *pSrc_pixels,uint32_t lr,uint32_t lg,uint32_t lb,uint32_t hr,uint32_t hg,
               uint32_t hb,uint8_t *sels)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  uint in_R9D;
  uint in_stack_00000008;
  uint local_8c;
  uint local_7c;
  int local_78;
  int d3;
  int d2;
  int d1;
  int d0;
  uint32_t i_1;
  int t2;
  int t1;
  int t0;
  uint32_t i;
  int dots [4];
  int ab;
  int ag;
  int ar;
  uint32_t block_b [4];
  uint32_t block_g [4];
  uint32_t block_r [4];
  
  ag = in_ESI << 3 | in_ESI >> 2;
  dots[2] = in_EDX << 2 | in_EDX >> 4;
  t0 = in_ECX << 3 | in_ECX >> 2;
  block_b[1] = in_R8D << 3 | in_R8D >> 2;
  uVar1 = in_R9D << 2 | in_R9D >> 4;
  dots[1] = in_stack_00000008 << 3 | in_stack_00000008 >> 2;
  ar = (ag * 2 + block_b[1]) / 3;
  dots[3] = (dots[2] * 2 + uVar1) / 3;
  i = (uint)(t0 * 2 + dots[1]) / 3;
  block_b[0] = (block_b[1] * 2 + ag) / 3;
  dots[0] = (uint)(dots[1] * 2 + t0) / 3;
  iVar2 = uVar1 - dots[2];
  for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
    (&local_78)[local_7c] =
         (&ag)[local_7c] * (block_b[1] - ag) + dots[(ulong)local_7c + 2] * iVar2 +
         (&t0)[local_7c] * (dots[1] - t0);
  }
  iVar3 = local_78 + d3;
  iVar4 = d3 + d2;
  iVar5 = d2 + d1;
  iVar6 = (block_b[1] - ag) * 2;
  iVar2 = iVar2 * 2;
  iVar7 = (dots[1] - t0) * 2;
  for (local_8c = 0; local_8c < 0x10; local_8c = local_8c + 4) {
    iVar8 = (uint)*(byte *)(in_RDI + (ulong)local_8c * 4) * iVar6 +
            (uint)*(byte *)(in_RDI + 1 + (ulong)local_8c * 4) * iVar2 +
            (uint)*(byte *)(in_RDI + 2 + (ulong)local_8c * 4) * iVar7;
    iVar9 = (uint)*(byte *)(in_RDI + (ulong)(local_8c + 1) * 4) * iVar6 +
            (uint)*(byte *)(in_RDI + 1 + (ulong)(local_8c + 1) * 4) * iVar2 +
            (uint)*(byte *)(in_RDI + 2 + (ulong)(local_8c + 1) * 4) * iVar7;
    iVar10 = (uint)*(byte *)(in_RDI + (ulong)(local_8c + 2) * 4) * iVar6 +
             (uint)*(byte *)(in_RDI + 1 + (ulong)(local_8c + 2) * 4) * iVar2 +
             (uint)*(byte *)(in_RDI + 2 + (ulong)(local_8c + 2) * 4) * iVar7;
    iVar11 = (uint)*(byte *)(in_RDI + (ulong)(local_8c + 3) * 4) * iVar6 +
             (uint)*(byte *)(in_RDI + 1 + (ulong)(local_8c + 3) * 4) * iVar2 +
             (uint)*(byte *)(in_RDI + 2 + (ulong)(local_8c + 3) * 4) * iVar7;
    *(uint8_t *)(CONCAT44(lb,hr) + (ulong)local_8c) =
         "\x03\x02\x01"
         [(int)((uint)(iVar8 <= iVar3) + (uint)(iVar8 < iVar4) + (uint)(iVar8 < iVar5))];
    *(uint8_t *)(CONCAT44(lb,hr) + (ulong)(local_8c + 1)) =
         "\x03\x02\x01"
         [(int)((uint)(iVar9 <= iVar3) + (uint)(iVar9 < iVar4) + (uint)(iVar9 < iVar5))];
    *(uint8_t *)(CONCAT44(lb,hr) + (ulong)(local_8c + 2)) =
         "\x03\x02\x01"
         [(int)((uint)(iVar10 <= iVar3) + (uint)(iVar10 < iVar4) + (uint)(iVar10 < iVar5))];
    *(uint8_t *)(CONCAT44(lb,hr) + (ulong)(local_8c + 3)) =
         "\x03\x02\x01"
         [(int)((uint)(iVar11 <= iVar3) + (uint)(iVar11 < iVar4) + (uint)(iVar11 < iVar5))];
  }
  return;
}

Assistant:

static inline void bc1_find_sels_2(const color32* pSrc_pixels, uint32_t lr, uint32_t lg, uint32_t lb, uint32_t hr, uint32_t hg, uint32_t hb, uint8_t sels[16])
	{
		uint32_t block_r[4], block_g[4], block_b[4];

		block_r[0] = (lr << 3) | (lr >> 2); block_g[0] = (lg << 2) | (lg >> 4);	block_b[0] = (lb << 3) | (lb >> 2);
		block_r[3] = (hr << 3) | (hr >> 2);	block_g[3] = (hg << 2) | (hg >> 4);	block_b[3] = (hb << 3) | (hb >> 2);
		block_r[1] = (block_r[0] * 2 + block_r[3]) / 3;	block_g[1] = (block_g[0] * 2 + block_g[3]) / 3;	block_b[1] = (block_b[0] * 2 + block_b[3]) / 3;
		block_r[2] = (block_r[3] * 2 + block_r[0]) / 3;	block_g[2] = (block_g[3] * 2 + block_g[0]) / 3;	block_b[2] = (block_b[3] * 2 + block_b[0]) / 3;

		int ar = block_r[3] - block_r[0], ag = block_g[3] - block_g[0], ab = block_b[3] - block_b[0];

		int dots[4];
		for (uint32_t i = 0; i < 4; i++)
			dots[i] = (int)block_r[i] * ar + (int)block_g[i] * ag + (int)block_b[i] * ab;

		int t0 = dots[0] + dots[1], t1 = dots[1] + dots[2], t2 = dots[2] + dots[3];

		ar *= 2; ag *= 2; ab *= 2;

		static const uint8_t s_sels[4] = { 3, 2, 1, 0 };

		for (uint32_t i = 0; i < 16; i += 4)
		{
			const int d0 = pSrc_pixels[i+0].r * ar + pSrc_pixels[i+0].g * ag + pSrc_pixels[i+0].b * ab;
			const int d1 = pSrc_pixels[i+1].r * ar + pSrc_pixels[i+1].g * ag + pSrc_pixels[i+1].b * ab;
			const int d2 = pSrc_pixels[i+2].r * ar + pSrc_pixels[i+2].g * ag + pSrc_pixels[i+2].b * ab;
			const int d3 = pSrc_pixels[i+3].r * ar + pSrc_pixels[i+3].g * ag + pSrc_pixels[i+3].b * ab;

			sels[i+0] = s_sels[(d0 <= t0) + (d0 < t1) + (d0 < t2)];
			sels[i+1] = s_sels[(d1 <= t0) + (d1 < t1) + (d1 < t2)];
			sels[i+2] = s_sels[(d2 <= t0) + (d2 < t1) + (d2 < t2)];
			sels[i+3] = s_sels[(d3 <= t0) + (d3 < t1) + (d3 < t2)];
		}
	}